

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  Fad<double> *pFVar9;
  Fad<double> *pFVar10;
  Fad<double> *pFVar11;
  
  pFVar5 = (this->left_->fadexpr_).left_;
  pFVar6 = (this->left_->fadexpr_).right_;
  pFVar7 = (pFVar5->fadexpr_).left_;
  pFVar8 = (pFVar5->fadexpr_).right_;
  pFVar5 = (this->right_->fadexpr_).left_;
  pFVar9 = (this->right_->fadexpr_).right_;
  pFVar10 = (pFVar5->fadexpr_).left_;
  pFVar11 = (pFVar5->fadexpr_).right_;
  dVar1 = pFVar7->val_;
  dVar2 = pFVar10->val_;
  dVar3 = pFVar8->val_;
  dVar4 = pFVar11->val_;
  return (pFVar6->val_ *
          ((pFVar7->dx_).ptr_to_data[i] * dVar3 + (pFVar8->dx_).ptr_to_data[i] * dVar1) +
         (pFVar6->dx_).ptr_to_data[i] * dVar3 * dVar1) -
         (pFVar9->val_ *
          ((pFVar10->dx_).ptr_to_data[i] * dVar4 + (pFVar11->dx_).ptr_to_data[i] * dVar2) +
         (pFVar9->dx_).ptr_to_data[i] * dVar4 * dVar2);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}